

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O1

void __thiscall glcts::anon_unknown_0::Uniform::~Uniform(Uniform *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer piVar3;
  
  pcVar2 = (this->shortName)._M_dataplus._M_p;
  paVar1 = &(this->shortName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->name)._M_dataplus._M_p;
  paVar1 = &(this->name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  std::
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ::~vector(&this->childUniforms);
  UniformValue::~UniformValue(&this->value);
  pcVar2 = (this->type).refStrType._M_dataplus._M_p;
  paVar1 = &(this->type).refStrType.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->type).strType._M_dataplus._M_p;
  paVar1 = &(this->type).strType.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  std::
  vector<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
  ::~vector(&(this->type).childTypes);
  piVar3 = (this->type).arraySizesSegmented.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar3 != (pointer)0x0) {
    operator_delete(piVar3,(long)(this->type).arraySizesSegmented.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)piVar3);
    return;
  }
  return;
}

Assistant:

Uniform(UniformValueGenerator& generator, UniformType _type, Loc _location,
			DefOccurence _declOccurence = DefOccurence::ALL_SH, DefOccurence _usageOccurence = DefOccurence::ALL_SH)
		: type(_type)
		, location(_location)
		, declOccurence(_declOccurence)
		, usageOccurence(_usageOccurence)
		, value(_type, generator)
	{

		if (type.isStruct())
		{
			int currentLocation = location.val;
			for (int arrayElem = 0; arrayElem < type.arraySize; arrayElem++)
			{
				for (size_t child = 0; child < type.childTypes.size(); child++)
				{
					Loc childLocation = Loc::Implicit();
					if (currentLocation > 0)
					{
						childLocation = Loc::C(currentLocation);
					}
					childUniforms.push_back(
						Uniform(generator, type.childTypes[child], childLocation, declOccurence, usageOccurence));
					currentLocation += type.childTypes[child].arraySize;
				}
			}
		}
	}